

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O3

byte * __thiscall nuraft::buffer::get_bytes(buffer *this,size_t *len)

{
  uint uVar1;
  ulong uVar2;
  overflow_error *this_00;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  buffer *pbVar7;
  
  uVar1 = *(uint *)this;
  uVar3 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar3 = 0xffff;
  }
  uVar5 = uVar1 >> 0x10;
  if ((int)uVar1 < 0) {
    uVar5 = *(uint *)(this + 4);
    lVar6 = 8;
  }
  else {
    lVar6 = 4;
  }
  if ((ulong)(uVar3 & uVar1) - (ulong)uVar5 < 4) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error
              (this_00,"insufficient buffer available for a bytes length (int32)");
  }
  else {
    pbVar7 = this + (ulong)uVar5 + lVar6;
    lVar6 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + ((uint)(byte)*pbVar7 << ((byte)lVar6 & 0x1f));
      lVar6 = lVar6 + 8;
      pbVar7 = pbVar7 + 1;
    } while (lVar6 != 0x20);
    if ((int)uVar1 < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 4;
    }
    else {
      *(short *)(this + 2) = (short)(uVar1 >> 0x10) + 4;
    }
    uVar2 = (ulong)iVar4;
    *len = uVar2;
    uVar1 = *(uint *)this;
    if ((int)uVar1 < 0) {
      uVar3 = *(uint *)(this + 4);
      if (uVar2 <= (ulong)(uVar1 & 0x7fffffff) - (ulong)uVar3) {
        *(uint *)(this + 4) = iVar4 + uVar3;
        return (byte *)(this + (ulong)uVar3 + 8);
      }
    }
    else if (uVar2 <= (ulong)(uVar1 & 0xffff) - (ulong)(uVar1 >> 0x10)) {
      *(short *)(this + 2) = (short)(uVar1 >> 0x10) + (short)iVar4;
      return (byte *)(this + (ulong)(uVar1 >> 0x10) + 4);
    }
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer available for a byte array");
  }
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}